

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chromosome.cpp
# Opt level: O1

value_type __thiscall Chromosome::del_gene(Chromosome *this,size_t chromno)

{
  pointer *ppbVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pbVar4;
  _Base_bitset<1UL> _Var5;
  pointer __src;
  
  pbVar3 = (this->genes).super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (this->genes).super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = pbVar3 + chromno;
  __src = pbVar2 + 1;
  _Var5._M_w = (pbVar2->super__Base_bitset<1UL>)._M_w;
  if (__src != pbVar4) {
    memmove(pbVar3 + chromno,__src,(long)pbVar4 - (long)__src);
  }
  ppbVar1 = &(this->genes).
             super__Vector_base<std::bitset<50UL>,_std::allocator<std::bitset<50UL>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppbVar1 = *ppbVar1 + -1;
  return (value_type)(_Base_bitset<1UL>)_Var5._M_w;
}

Assistant:

Chromosome::genes_t::value_type Chromosome::del_gene( size_t chromno )
{
	genes_t::value_type ret = genes[chromno];
	genes.erase(genes.begin() + chromno);

	return ret;
}